

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall cursespp::App::Run(App *this,ILayoutPtr *layout)

{
  IInput **ppIVar1;
  _Map_pointer ppbVar2;
  IKeyHandler *pIVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  App *pAVar7;
  IWindow *parent;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t ch;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string kn;
  Event event;
  MEVENT rawMouseEvent;
  MouseButtonState mouseButtonState;
  int local_d0;
  int local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  element_type *local_a8;
  ILayoutPtr local_a0;
  _Any_data *local_90;
  string local_88;
  MEVENT local_64;
  MouseButtonState local_50;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  (this->state).input = (IInput *)0x0;
  (this->state).keyHandler = (IKeyHandler *)0x0;
  local_cc = Screen::GetWidth();
  local_d0 = Screen::GetHeight();
  local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (layout->super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (layout->super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  ChangeLayout(this,&local_a0);
  if (local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ppIVar1 = &(this->state).input;
  local_50.wasDown = false;
  local_50.clicked = false;
  local_50.doubleClicked = false;
  local_50.lastX = -1;
  local_50.lastY = -1;
  local_50.time = -1;
  local_90 = (_Any_data *)&this->keyHandler;
LAB_0015610b:
  if ((this->quit != false) || ((disconnected & 1) != 0)) {
    OverlayStack::Clear(&overlays);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x188174);
  ppbVar2 = (this->injectedKeys).c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->injectedKeys).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->injectedKeys).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
      ((long)(this->injectedKeys).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->injectedKeys).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)ppbVar2 -
                (long)(this->injectedKeys).c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppbVar2 == (_Map_pointer)0x0)) * 0x10 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_c8);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
    goto LAB_00156259;
  }
  if ((*ppIVar1 == (IInput *)0x0) ||
     (iVar6 = (*(((this->state).focused.
                  super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_IOrderable)._vptr_IOrderable[0x22])(), CONCAT44(extraout_var,iVar6) == 0)) {
    iVar6 = wgetch(_stdscr);
    ch = extraout_RDX_00;
  }
  else {
    iVar6 = (*(((this->state).focused.
                super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_IOrderable)._vptr_IOrderable[0x22])();
    keypad(iVar6,1);
    wtimeout(iVar6);
    iVar6 = wgetch(iVar6);
    ch = extraout_RDX;
  }
  if (iVar6 != -1) goto code_r0x001561e7;
  goto LAB_001563c9;
code_r0x001561e7:
  cursespp::key::Read_abi_cxx11_(&local_88,(key *)(long)iVar6,ch);
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (((this->keyHook).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar5 = (*(this->keyHook)._M_invoker)((_Any_data *)&this->keyHook,&local_c8), bVar5))
  goto LAB_0015610b;
  if (iVar6 == 9) {
    FocusNextInLayout(this);
    goto LAB_001563c9;
  }
LAB_00156259:
  iVar6 = std::__cxx11::string::compare((char *)&local_c8);
  if (iVar6 == 0) {
    FocusPrevInLayout(this);
    goto LAB_001563c9;
  }
  if (((char *)local_c8._M_string_length == (char *)(this->quitKey)._M_string_length) &&
     (((char *)local_c8._M_string_length == (char *)0x0 ||
      (iVar6 = bcmp(local_c8._M_dataplus._M_p,(this->quitKey)._M_dataplus._M_p,
                    local_c8._M_string_length), iVar6 == 0)))) {
    this->quit = true;
    goto LAB_001563c9;
  }
  if ((this->mouseEnabled == true) &&
     (iVar6 = std::__cxx11::string::compare((char *)&local_c8), iVar6 == 0)) {
    iVar6 = getmouse(&local_64);
    if (iVar6 != 0) goto LAB_001563c9;
    pAVar7 = (App *)&(this->injectedKeys).c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
    if ((this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pAVar7 = this;
    }
    local_a8 = (pAVar7->state).overlay.
               super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (pAVar7->state).overlay.
              super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (local_a8 != (element_type *)0x0) {
      parent = (IWindow *)
               __dynamic_cast(local_a8,&ILayout::typeinfo,&IWindow::typeinfo,0xfffffffffffffffe);
      IMouseHandler::Event::Event((Event *)&local_88,&local_64,parent);
      if (((mmask_t)local_88._M_string_length & 0x210000) == 0) {
        bVar5 = MouseButtonState::Update(&local_50,&local_64);
        if (bVar5) {
          local_88._M_string_length._0_4_ = MouseButtonState::ToCursesState(&local_50);
          goto LAB_0015649c;
        }
      }
      else {
        local_a8 = (element_type *)
                   (this->state).focused.
                   super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (local_a8 != (element_type *)0x0) {
LAB_0015649c:
          (*(local_a8->super_IMouseHandler)._vptr_IMouseHandler[2])(&local_a8->super_IMouseHandler);
        }
      }
    }
  }
  else {
    if ((((*ppIVar1 != (IInput *)0x0) &&
         ((iVar6 = (*(((this->state).focused.
                       super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     super_IOrderable)._vptr_IOrderable[0x23])(), (char)iVar6 != '\0' &&
          (iVar6 = (*(*ppIVar1)->_vptr_IInput[2])(), (char)iVar6 != '\0')))) ||
        (((this->keyHandler).super__Function_base._M_manager != (_Manager_type)0x0 &&
         (bVar5 = (*(this->keyHandler)._M_invoker)(local_90,&local_c8), bVar5)))) ||
       ((pIVar3 = (this->state).keyHandler, pIVar3 != (IKeyHandler *)0x0 &&
        (iVar6 = (*pIVar3->_vptr_IKeyHandler[2])(), (char)iVar6 != '\0')))) goto LAB_001563c9;
    pAVar7 = (App *)&(this->injectedKeys).c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
    if ((this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pAVar7 = this;
    }
    peVar4 = (pAVar7->state).overlay.
             super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (pAVar7->state).overlay.
              super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*(peVar4->super_IKeyHandler)._vptr_IKeyHandler[2])(&peVar4->super_IKeyHandler);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_001563c9:
  iVar6 = Screen::GetWidth();
  bVar5 = true;
  if (local_cc == iVar6) {
    iVar6 = Screen::GetHeight();
    bVar5 = local_d0 != iVar6;
  }
  resized = (bool)(resized | bVar5);
  if (resized != false) {
    local_cc = Screen::GetWidth();
    local_d0 = Screen::GetHeight();
    NotifyResized(this);
  }
  Layout(this);
  goto LAB_0015610b;
}

Assistant:

void App::Run(ILayoutPtr layout) {
#ifdef WIN32
    if (App::Running(this->uniqueId, this->appTitle)) {
        return;
    }
#endif

    int64_t ch;
    std::string kn;

    this->state.input = nullptr;
    this->state.keyHandler = nullptr;
    int lastWidth = Screen::GetWidth();
    int lastHeight = Screen::GetHeight();

    this->ChangeLayout(layout);

    MEVENT rawMouseEvent;
    MouseButtonState mouseButtonState;

    while (!this->quit && !disconnected) {
        kn = "";

        if (this->injectedKeys.size()) {
            kn = injectedKeys.front();
            injectedKeys.pop();
            ch = ERR;
            goto process;
        }

        if (this->state.input && this->state.focused->GetContent()) {
            /* if the focused window is an input, allow it to draw a cursor */
            WINDOW *c = this->state.focused->GetContent();
            keypad(c, TRUE);
            wtimeout(c, IDLE_TIMEOUT_MS);
            ch = wgetch(c);
        }
        else {
            /* otherwise, no cursor */
            ch = wgetch(stdscr);
        }

        if (ch != ERR) {
            kn = key::Read((int) ch);

            if (this->keyHook) {
                if (this->keyHook(kn)) {
                    continue;
                }
            }

process:
            if (ch == '\t') { /* tab */
                this->FocusNextInLayout();
            }
            else if (kn == "KEY_BTAB") { /* shift-tab */
                this->FocusPrevInLayout();
            }
            else if (kn == this->quitKey) { /* ctrl+d quits */
                this->quit = true;
            }
#ifdef WIN32
            else if (kn == "KEY_RESIZE") {
                resized = true;
            }
#endif
            else if (this->mouseEnabled && kn == "KEY_MOUSE") {
#ifdef WIN32
                if (nc_getmouse(&rawMouseEvent) == 0) {
#else
                if (getmouse(&rawMouseEvent) == 0) {
#endif
                    auto active = this->state.ActiveLayout();
                    if (active) {
                        using Event = IMouseHandler::Event;
                        auto window = dynamic_cast<IWindow*>(active.get());
                        Event event(rawMouseEvent, window);
                        if (event.MouseWheelDown() || event.MouseWheelUp()) {
                            if (state.focused) {
                                state.focused->ProcessMouseEvent(event);
                            }
                        }
                        else if (mouseButtonState.Update(rawMouseEvent)) {
                            event.state = mouseButtonState.ToCursesState();
                            active->ProcessMouseEvent(event);
                        }
                    }
                }
            }
            /* order: focused input, global key handler, then layout. */
            else if (!this->state.input ||
                !this->state.focused->IsVisible() ||
                !this->state.input->Write(kn))
            {
                if (!keyHandler || !keyHandler(kn)) {
                    if (!this->state.keyHandler || !this->state.keyHandler->KeyPress(kn)) {
                        this->state.ActiveLayout()->KeyPress(kn);
                    }
                }
            }
        }

        resized |=
            lastWidth != Screen::GetWidth() ||
            lastHeight != Screen::GetHeight();
        if (resized) {
            lastWidth = Screen::GetWidth();
            lastHeight = Screen::GetHeight();
            this->NotifyResized();
        }

        this->Layout();
    }

    overlays.Clear();
}

void App::NotifyResized() {
    resized = false;
    resize_term(0, 0);
    Window::InvalidateScreen();
    if (this->resizeHandler) {
        this->resizeHandler();
    }
    this->OnResized();
}

void App::Layout() {
    this->CheckShowOverlay();
    this->EnsureFocusIsValid();

    /* we want to dispatch messages here, before we call WriteToScreen(),
    because dispatched messages may trigger UI updates, including layouts,
    which may lead panels to get destroyed and recreated, which can
    cause the screen to redraw outside of do_update() calls. so we dispatch
    messages, ensure our overlay is on top, then do a redraw. */
    Window::MessageQueue().Dispatch();

    if (this->state.overlayWindow) {
        this->state.overlay->BringToTop(); /* active overlay is always on top... */
    }

    /* always last to avoid flicker. see above. */
    Window::WriteToScreen(this->state.input);
}

void App::UpdateFocusedWindow(IWindowPtr window) {
    if (this->state.focused != window) {
        this->state.focused = window;
        this->state.input = dynamic_cast<IInput*>(window.get());
        this->state.keyHandler = dynamic_cast<IKeyHandler*>(window.get());

        if (this->state.focused) {
            this->state.focused->Focus();
        }
    }
}

void App::EnsureFocusIsValid() {
    ILayoutPtr layout = this->state.ActiveLayout();
    if (layout) {
        IWindowPtr focused = layout->GetFocus();
        if (focused != this->state.focused) {
            this->UpdateFocusedWindow(focused);
            Window::InvalidateScreen();
        }
    }
}

OverlayStack& App::Overlays() {
    return overlays;
}

void App::CheckShowOverlay() {
    ILayoutPtr top = overlays.Top();

    if (top != this->state.overlay) {
        if (this->state.overlay) {
            this->state.overlay->Hide();
        }

        this->state.overlay = top;

        this->state.overlayWindow =
            top ? dynamic_cast<IWindow*>(top.get()) : nullptr;

        ILayoutPtr newTopLayout = this->state.ActiveLayout();
        if (newTopLayout) {
            newTopLayout->Layout();
            newTopLayout->Show();
            newTopLayout->BringToTop();
            newTopLayout->FocusFirst();
        }
    }
}

ILayoutPtr App::GetLayout() {
    return this->state.layout;
}

void App::ChangeLayout(ILayoutPtr newLayout) {
    if (this->state.layout == newLayout) {
        return;
    }

    if (this->state.input && this->state.focused) {
        wtimeout(this->state.focused->GetContent(), IDLE_TIMEOUT_MS);
    }

    if (this->state.layout) {
        this->state.layout->Hide();
        this->state.layout.reset();
    }

    if (newLayout) {
        this->state.layout = newLayout;
        this->state.rootWindow = dynamic_cast<IWindow*>(this->state.layout.get());

        if (this->state.rootWindow) {
            this->state.rootWindow->MoveAndResize(
                0, 0, Screen::GetWidth(), Screen::GetHeight());
        }

        this->state.layout->Show();
        this->state.layout->BringToTop();

        if (!this->state.overlay) {
            this->UpdateFocusedWindow(this->state.layout->GetFocus());
        }
    }

    this->CheckShowOverlay();
}

void App::FocusNextInLayout() {
    if (!this->state.ActiveLayout()) {
        return;
    }

    this->UpdateFocusedWindow(this->state.ActiveLayout()->FocusNext());
}

void App::FocusPrevInLayout() {
    if (!this->state.ActiveLayout()) {
        return;
    }

    this->UpdateFocusedWindow(this->state.ActiveLayout()->FocusPrev());
}

int64_t App::Now() {
    return duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
}